

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderImageSizeTests.cpp
# Opt level: O1

long __thiscall
glcts::anon_unknown_0::AdvancedNonMS<tcu::Vector<unsigned_int,_4>,_4>::Run
          (AdvancedNonMS<tcu::Vector<unsigned_int,_4>,_4> *this)

{
  CallLogWrapper *this_00;
  long lVar1;
  GLint level;
  GLuint texture;
  GLuint unit;
  GLboolean layered;
  GLint layer;
  int i;
  ulong uVar2;
  GLenum *pGVar3;
  GLenum GVar4;
  ImageSizeMachine machine;
  ivec4 res [4];
  
  this_00 = &(this->super_ShaderImageSizeBase).super_SubcaseBase.super_GLWrapper.
             super_CallLogWrapper;
  pGVar3 = &DAT_01b4e740;
  uVar2 = 0;
  do {
    GVar4 = *pGVar3;
    glu::CallLogWrapper::glBindTexture(this_00,GVar4,this->m_texture[uVar2]);
    glu::CallLogWrapper::glTexParameteri(this_00,GVar4,0x2801,0x2600);
    glu::CallLogWrapper::glTexParameteri(this_00,GVar4,0x2800,0x2600);
    switch(uVar2 & 0xffffffff) {
    case 0:
      glu::CallLogWrapper::glTexStorage3D(this_00,GVar4,2,0x8d70,2,2,7);
      texture = this->m_texture[uVar2];
      unit = 0;
      layered = '\0';
      layer = 3;
      goto LAB_00c7aad6;
    case 1:
      glu::CallLogWrapper::glTexStorage3D(this_00,GVar4,3,0x8d70,4,4,2);
      texture = this->m_texture[uVar2];
      unit = 1;
      break;
    case 2:
      glu::CallLogWrapper::glTexStorage2D(this_00,GVar4,2,0x8d70,2,2);
      texture = this->m_texture[uVar2];
      unit = 2;
      level = 0;
      layered = '\x01';
      layer = 0;
      GVar4 = 0x88ba;
      goto LAB_00c7aae0;
    case 3:
      glu::CallLogWrapper::glTexStorage3D(this_00,GVar4,4,0x8d70,0xd,7,4);
      texture = this->m_texture[uVar2];
      unit = 3;
      break;
    default:
      goto switchD_00c7a9c8_default;
    }
    layered = '\x01';
    layer = 0;
LAB_00c7aad6:
    level = 1;
    GVar4 = 35000;
LAB_00c7aae0:
    glu::CallLogWrapper::glBindImageTexture(this_00,unit,texture,level,layered,layer,GVar4,0x8d70);
switchD_00c7a9c8_default:
    uVar2 = uVar2 + 1;
    pGVar3 = pGVar3 + 1;
    if (uVar2 == 4) {
      ImageSizeMachine::ImageSizeMachine(&machine);
      res[0].m_data._0_8_ = &DAT_100000001;
      res[0].m_data[2] = 0;
      res[0].m_data[3] = 0;
      res[1].m_data[0] = 2;
      res[1].m_data[1] = 2;
      res[1].m_data[2] = 1;
      res[1].m_data[3] = 0;
      res[2].m_data[0] = 2;
      res[2].m_data[1] = 2;
      res[2].m_data[2] = 0;
      res[2].m_data[3] = 0;
      res[3].m_data[0] = 6;
      res[3].m_data[1] = 3;
      res[3].m_data[2] = 4;
      res[3].m_data[3] = 0;
      lVar1 = glcts::(anonymous_namespace)::ImageSizeMachine::Run<tcu::Vector<unsigned_int,4>>
                        ((ImageSizeMachine *)&machine,4,res);
      ImageSizeMachine::~ImageSizeMachine(&machine);
      return lVar1;
    }
  } while( true );
}

Assistant:

virtual long Run()
	{
		if (STAGE == 0 && !IsVSFSAvailable(4, 0))
			return NOT_SUPPORTED;
		if (STAGE == 5 && !IsVSFSAvailable(0, 4))
			return NOT_SUPPORTED;

		const GLenum target[4] = { GL_TEXTURE_2D_ARRAY, GL_TEXTURE_3D, GL_TEXTURE_CUBE_MAP, GL_TEXTURE_2D_ARRAY };
		for (int i = 0; i < 4; ++i)
		{
			glBindTexture(target[i], m_texture[i]);
			glTexParameteri(target[i], GL_TEXTURE_MIN_FILTER, GL_NEAREST);
			glTexParameteri(target[i], GL_TEXTURE_MAG_FILTER, GL_NEAREST);

			if (i == 0)
			{
				glTexStorage3D(target[i], 2, TexInternalFormat<T>(), 2, 2, 7);
				glBindImageTexture(0, m_texture[i], 1, GL_FALSE, 3, GL_READ_ONLY, TexInternalFormat<T>());
			}
			else if (i == 1)
			{
				glTexStorage3D(target[i], 3, TexInternalFormat<T>(), 4, 4, 2);
				glBindImageTexture(1, m_texture[i], 1, GL_TRUE, 0, GL_READ_ONLY, TexInternalFormat<T>());
			}
			else if (i == 2)
			{
				glTexStorage2D(target[i], 2, TexInternalFormat<T>(), 2, 2);
				glBindImageTexture(2, m_texture[i], 0, GL_TRUE, 0, GL_READ_WRITE, TexInternalFormat<T>());
			}
			else if (i == 3)
			{
				glTexStorage3D(target[i], 4, TexInternalFormat<T>(), 13, 7, 4);
				glBindImageTexture(3, m_texture[i], 1, GL_TRUE, 0, GL_READ_ONLY, TexInternalFormat<T>());
			}
		}
		ImageSizeMachine machine;
		ivec4			 res[4] = { ivec4(1, 1, 0, 0), ivec4(2, 2, 1, 0), ivec4(2, 2, 0, 0), ivec4(6, 3, 4, 0) };
		return machine.Run<T>(STAGE, res);
	}